

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O1

void __thiscall
btSpatialTransformationMatrix::transformInverse<btSpatialForceVector>
          (btSpatialTransformationMatrix *this,btSpatialForceVector *inVec,
          btSpatialForceVector *outVec,eOutputOperation outOp)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  if (outOp == Subtract) {
    fVar14 = (inVec->m_topVec).m_floats[0];
    fVar11 = (inVec->m_topVec).m_floats[1];
    fVar1 = (inVec->m_topVec).m_floats[2];
    fVar15 = (this->m_rotMat).m_el[1].m_floats[2];
    fVar2 = (this->m_rotMat).m_el[0].m_floats[2];
    fVar3 = (this->m_rotMat).m_el[2].m_floats[2];
    uVar4 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
    uVar5 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
    uVar6 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
    uVar7 = *(undefined8 *)(outVec->m_topVec).m_floats;
    *(ulong *)(outVec->m_topVec).m_floats =
         CONCAT44((float)((ulong)uVar7 >> 0x20) -
                  (fVar1 * (float)((ulong)uVar6 >> 0x20) +
                  fVar14 * (float)((ulong)uVar4 >> 0x20) + fVar11 * (float)((ulong)uVar5 >> 0x20)),
                  (float)uVar7 -
                  (fVar1 * (float)uVar6 + fVar14 * (float)uVar4 + fVar11 * (float)uVar5));
    (outVec->m_topVec).m_floats[2] =
         (outVec->m_topVec).m_floats[2] - (fVar3 * fVar1 + fVar2 * fVar14 + fVar15 * fVar11);
    fVar14 = (this->m_trnVec).m_floats[1];
    fVar11 = (inVec->m_topVec).m_floats[2];
    fVar1 = (this->m_trnVec).m_floats[2];
    fVar15 = (inVec->m_topVec).m_floats[0];
    fVar2 = (inVec->m_topVec).m_floats[1];
    fVar3 = (this->m_trnVec).m_floats[0];
    fVar12 = (fVar14 * fVar11 - fVar2 * fVar1) + (inVec->m_bottomVec).m_floats[0];
    fVar13 = (fVar1 * fVar15 - fVar11 * fVar3) + (inVec->m_bottomVec).m_floats[1];
    fVar15 = (fVar3 * fVar2 - fVar15 * fVar14) + (inVec->m_bottomVec).m_floats[2];
    fVar14 = (this->m_rotMat).m_el[1].m_floats[2];
    fVar11 = (this->m_rotMat).m_el[0].m_floats[2];
    fVar1 = (this->m_rotMat).m_el[2].m_floats[2];
    uVar4 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
    uVar5 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
    uVar6 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
    uVar7 = *(undefined8 *)(outVec->m_bottomVec).m_floats;
    *(ulong *)(outVec->m_bottomVec).m_floats =
         CONCAT44((float)((ulong)uVar7 >> 0x20) -
                  (fVar15 * (float)((ulong)uVar6 >> 0x20) +
                  fVar12 * (float)((ulong)uVar4 >> 0x20) + fVar13 * (float)((ulong)uVar5 >> 0x20)),
                  (float)uVar7 -
                  (fVar15 * (float)uVar6 + fVar12 * (float)uVar4 + fVar13 * (float)uVar5));
    (outVec->m_bottomVec).m_floats[2] =
         (outVec->m_bottomVec).m_floats[2] - (fVar1 * fVar15 + fVar11 * fVar12 + fVar14 * fVar13);
  }
  else {
    if (outOp == Add) {
      fVar14 = (inVec->m_topVec).m_floats[0];
      fVar11 = (inVec->m_topVec).m_floats[1];
      fVar1 = (inVec->m_topVec).m_floats[2];
      fVar15 = (this->m_rotMat).m_el[1].m_floats[2];
      fVar2 = (this->m_rotMat).m_el[0].m_floats[2];
      fVar3 = (this->m_rotMat).m_el[2].m_floats[2];
      uVar4 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
      uVar5 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
      uVar6 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
      uVar7 = *(undefined8 *)(outVec->m_topVec).m_floats;
      uVar8 = *(undefined8 *)(outVec->m_bottomVec).m_floats;
      *(ulong *)(outVec->m_topVec).m_floats =
           CONCAT44((float)((ulong)uVar7 >> 0x20) +
                    fVar1 * (float)((ulong)uVar6 >> 0x20) +
                    fVar14 * (float)((ulong)uVar4 >> 0x20) + fVar11 * (float)((ulong)uVar5 >> 0x20),
                    (float)uVar7 +
                    fVar1 * (float)uVar6 + fVar14 * (float)uVar4 + fVar11 * (float)uVar5);
      (outVec->m_topVec).m_floats[2] =
           fVar3 * fVar1 + fVar2 * fVar14 + fVar15 * fVar11 + (outVec->m_topVec).m_floats[2];
      fVar14 = (this->m_trnVec).m_floats[1];
      fVar11 = (inVec->m_topVec).m_floats[2];
      fVar1 = (this->m_trnVec).m_floats[2];
      fVar15 = (inVec->m_topVec).m_floats[0];
      fVar2 = (inVec->m_topVec).m_floats[1];
      fVar3 = (this->m_trnVec).m_floats[0];
      fVar12 = (fVar14 * fVar11 - fVar2 * fVar1) + (inVec->m_bottomVec).m_floats[0];
      fVar13 = (fVar1 * fVar15 - fVar11 * fVar3) + (inVec->m_bottomVec).m_floats[1];
      fVar15 = (fVar3 * fVar2 - fVar15 * fVar14) + (inVec->m_bottomVec).m_floats[2];
      fVar14 = (this->m_rotMat).m_el[1].m_floats[2];
      fVar11 = (this->m_rotMat).m_el[0].m_floats[2];
      fVar1 = (this->m_rotMat).m_el[2].m_floats[2];
      uVar4 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
      uVar5 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
      uVar6 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
      *(ulong *)(outVec->m_bottomVec).m_floats =
           CONCAT44(fVar15 * (float)((ulong)uVar6 >> 0x20) +
                    fVar12 * (float)((ulong)uVar4 >> 0x20) + fVar13 * (float)((ulong)uVar5 >> 0x20)
                    + (float)((ulong)uVar8 >> 0x20),
                    fVar15 * (float)uVar6 + fVar12 * (float)uVar4 + fVar13 * (float)uVar5 +
                    (float)uVar8);
      (outVec->m_bottomVec).m_floats[2] =
           fVar1 * fVar15 + fVar11 * fVar12 + fVar14 * fVar13 + (outVec->m_bottomVec).m_floats[2];
      return;
    }
    if (outOp == None) {
      fVar14 = (inVec->m_topVec).m_floats[0];
      fVar11 = (inVec->m_topVec).m_floats[1];
      fVar1 = (inVec->m_topVec).m_floats[2];
      uVar4 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
      uVar5 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
      uVar6 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
      auVar9._4_4_ = fVar1 * (float)((ulong)uVar6 >> 0x20) +
                     fVar14 * (float)((ulong)uVar4 >> 0x20) + fVar11 * (float)((ulong)uVar5 >> 0x20)
      ;
      auVar9._0_4_ = fVar1 * (float)uVar6 + fVar14 * (float)uVar4 + fVar11 * (float)uVar5;
      auVar9._8_4_ = fVar1 * (this->m_rotMat).m_el[2].m_floats[2] +
                     fVar14 * (this->m_rotMat).m_el[0].m_floats[2] +
                     fVar11 * (this->m_rotMat).m_el[1].m_floats[2];
      auVar9._12_4_ = 0;
      *(undefined1 (*) [16])(outVec->m_topVec).m_floats = auVar9;
      fVar14 = (this->m_trnVec).m_floats[1];
      fVar11 = (inVec->m_topVec).m_floats[2];
      fVar1 = (this->m_trnVec).m_floats[2];
      fVar15 = (inVec->m_topVec).m_floats[0];
      fVar2 = (inVec->m_topVec).m_floats[1];
      fVar3 = (this->m_trnVec).m_floats[0];
      fVar12 = (fVar14 * fVar11 - fVar2 * fVar1) + (inVec->m_bottomVec).m_floats[0];
      fVar11 = (fVar1 * fVar15 - fVar11 * fVar3) + (inVec->m_bottomVec).m_floats[1];
      fVar14 = (fVar3 * fVar2 - fVar15 * fVar14) + (inVec->m_bottomVec).m_floats[2];
      uVar4 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
      uVar5 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
      uVar6 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
      auVar10._4_4_ =
           fVar14 * (float)((ulong)uVar6 >> 0x20) +
           fVar12 * (float)((ulong)uVar4 >> 0x20) + fVar11 * (float)((ulong)uVar5 >> 0x20);
      auVar10._0_4_ = fVar14 * (float)uVar6 + fVar12 * (float)uVar4 + fVar11 * (float)uVar5;
      auVar10._8_4_ =
           fVar14 * (this->m_rotMat).m_el[2].m_floats[2] +
           fVar12 * (this->m_rotMat).m_el[0].m_floats[2] +
           fVar11 * (this->m_rotMat).m_el[1].m_floats[2];
      auVar10._12_4_ = 0;
      *(undefined1 (*) [16])(outVec->m_bottomVec).m_floats = auVar10;
      return;
    }
  }
  return;
}

Assistant:

void transformInverse(	const SpatialVectorType &inVec,
							SpatialVectorType &outVec,
							eOutputOperation outOp = None)
	{
		if(outOp == None)
		{
			outVec.m_topVec = m_rotMat.transpose() * inVec.m_topVec;
			outVec.m_bottomVec = m_rotMat.transpose() * (inVec.m_bottomVec + m_trnVec.cross(inVec.m_topVec));
		}
		else if(outOp == Add)
		{
			outVec.m_topVec += m_rotMat.transpose() * inVec.m_topVec;
			outVec.m_bottomVec += m_rotMat.transpose() * (inVec.m_bottomVec + m_trnVec.cross(inVec.m_topVec));
		}
		else if(outOp == Subtract)
		{
			outVec.m_topVec -= m_rotMat.transpose() * inVec.m_topVec;
			outVec.m_bottomVec -= m_rotMat.transpose() * (inVec.m_bottomVec + m_trnVec.cross(inVec.m_topVec));
		}			
	}